

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

bool __thiscall IMLE::load(IMLE *this,string *filename)

{
  char cVar1;
  basic_iserializer *pbVar2;
  void *x;
  text_iarchive archive;
  ifstream fs;
  text_iarchive local_2a0;
  istream local_220 [520];
  
  std::ifstream::ifstream(local_220,(filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0,
                   "IMLE: Could not open file ",filename);
    message(this,(string *)&local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != &local_2a0.field_0x10) {
      operator_delete((void *)local_2a0._0_8_);
    }
  }
  else {
    boost::archive::text_iarchive::text_iarchive(&local_2a0,local_220,0);
    reset(this);
    pbVar2 = &boost::serialization::
              singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_IMLE>_>::
              get_instance()->super_basic_iserializer;
    boost::archive::detail::basic_iarchive::load_object((basic_iarchive *)&local_2a0,this,pbVar2);
    std::ifstream::close();
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&local_2a0.super_text_iarchive_impl<boost::archive::text_iarchive>);
  }
  std::ifstream::~ifstream(local_220);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::load(std::string const &filename)
{
    std::ifstream fs(filename.c_str());
	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_iarchive archive(fs);

    reset();
	archive & (*this);
    fs.close();

    return true;
}